

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

void __thiscall
kratos::ReturnStmt::ReturnStmt
          (ReturnStmt *this,FunctionStmtBlock *func_def,shared_ptr<kratos::Var> *value)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  Stmt::Stmt(&this->super_Stmt,Return);
  (this->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002a55b0;
  this->func_def_ = func_def;
  (this->value_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (value->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->value_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (value->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (value->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->value_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  (value->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  return;
}

Assistant:

ReturnStmt::ReturnStmt(FunctionStmtBlock *func_def, std::shared_ptr<Var> value)
    : Stmt(StatementType::Return), func_def_(func_def), value_(std::move(value)) {}